

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O0

bool QSharedMemory::isKeyTypeSupported(Type type)

{
  long lVar1;
  bool bVar2;
  Type in_DI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe8;
  undefined1 local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QtIpcCommon::isIpcSupported(SharedMemory,in_DI);
  if (bVar2) {
    local_a = QtIpcCommon::
              IpcStorageVariant<&QSharedMemoryPrivate::Backend::posix,&QSharedMemoryPrivate::Backend::sysv,&QSharedMemoryPrivate::Backend::win32>
              ::staticVisit<QSharedMemory::isKeyTypeSupported(QNativeIpcKey::Type)::__0>
                        (in_DI,in_stack_ffffffffffffffe8);
  }
  else {
    local_a = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemory::isKeyTypeSupported(QNativeIpcKey::Type type)
{
    if (!isIpcSupported(IpcType::SharedMemory, type))
        return false;
    using Variant = decltype(QSharedMemoryPrivate::backend);
    return Variant::staticVisit(type, [](auto ptr) {
        using Impl = std::decay_t<decltype(*ptr)>;
        return Impl::runtimeSupportCheck();
    });
}